

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.h
# Opt level: O0

size_t __thiscall
threadsafe::ring_buffer<sig::ProtoSignal<void_()>::Link>::size
          (ring_buffer<sig::ProtoSignal<void_()>::Link> *this)

{
  bool bVar1;
  undefined1 local_28 [8];
  undefined1 local_20 [8];
  const_iterator it;
  size_t i;
  ring_buffer<sig::ProtoSignal<void_()>::Link> *this_local;
  
  it.node_ = (node_pointer_type)0x0;
  begin((ring_buffer<sig::ProtoSignal<void_()>::Link> *)local_20);
  while( true ) {
    end((ring_buffer<sig::ProtoSignal<void_()>::Link> *)local_28);
    bVar1 = impl::Iterator<sig::ProtoSignal<void_()>::Link,_true>::operator!=
                      ((Iterator<sig::ProtoSignal<void_()>::Link,_true> *)local_20,
                       (Iterator<sig::ProtoSignal<void_()>::Link,_true> *)local_28);
    impl::Iterator<sig::ProtoSignal<void_()>::Link,_true>::~Iterator
              ((Iterator<sig::ProtoSignal<void_()>::Link,_true> *)local_28);
    if (!bVar1) break;
    it.node_ = (node_pointer_type)
               ((long)&((it.node_)->val).func.super__Function_base._M_functor + 1);
    impl::Iterator<sig::ProtoSignal<void_()>::Link,_true>::operator++
              ((Iterator<sig::ProtoSignal<void_()>::Link,_true> *)local_20);
  }
  impl::Iterator<sig::ProtoSignal<void_()>::Link,_true>::~Iterator
            ((Iterator<sig::ProtoSignal<void_()>::Link,_true> *)local_20);
  return (size_t)it.node_;
}

Assistant:

size_t size() const {
        size_t i = 0;
        for(auto it = begin(); it != end(); ++it) {
            ++i;
        }
        return i;
    }